

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O2

int accumulate_fit(float *flr,float *mdct,int x0,int x1,lsfit_acc *a,int n,vorbis_info_floor1 *info)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  
  a->x2b = 0;
  a->y2b = 0;
  a->xyb = 0;
  a->bn = 0;
  a->xya = 0;
  a->an = 0;
  a->xb = 0;
  a->yb = 0;
  a->xa = 0;
  a->ya = 0;
  a->x2a = 0;
  a->y2a = 0;
  a->x0 = x0;
  a->x1 = x1;
  iVar1 = n + -1;
  if (x1 < n) {
    iVar1 = x1;
  }
  local_44 = 0;
  iVar8 = 0;
  iVar5 = 0;
  iVar6 = 0;
  iVar11 = 0;
  iVar2 = 0;
  iVar12 = 0;
  iVar9 = 0;
  iVar10 = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  for (lVar3 = (long)x0; lVar3 <= iVar1; lVar3 = lVar3 + 1) {
    iVar4 = (int)(flr[lVar3] * 7.3142858 + 1023.5);
    iVar7 = iVar4;
    if (iVar4 < 1) {
      iVar7 = 0;
    }
    if (0x3fe < iVar7) {
      iVar7 = 0x3ff;
    }
    if (0 < iVar4) {
      iVar4 = (int)lVar3;
      if (flr[lVar3] <= mdct[lVar3] + info->twofitatten) {
        local_44 = local_44 + iVar4;
        iVar8 = iVar8 + iVar7;
        iVar5 = iVar5 + iVar4 * iVar4;
        iVar6 = iVar6 + iVar7 * iVar7;
        iVar11 = iVar11 + iVar7 * iVar4;
        iVar2 = iVar2 + 1;
      }
      else {
        iVar12 = iVar12 + iVar4;
        iVar9 = iVar9 + iVar7;
        iVar10 = iVar10 + iVar4 * iVar4;
        local_48 = local_48 + iVar7 * iVar7;
        local_4c = local_4c + iVar7 * iVar4;
        local_50 = local_50 + 1;
      }
    }
  }
  a->xa = local_44;
  a->ya = iVar8;
  a->x2a = iVar5;
  a->y2a = iVar6;
  a->xya = iVar11;
  a->an = iVar2;
  a->xb = iVar12;
  a->yb = iVar9;
  a->x2b = iVar10;
  a->y2b = local_48;
  a->xyb = local_4c;
  a->bn = local_50;
  return iVar2;
}

Assistant:

static int accumulate_fit(const float *flr,const float *mdct,
                          int x0, int x1,lsfit_acc *a,
                          int n,vorbis_info_floor1 *info){
  long i;

  int xa=0,ya=0,x2a=0,y2a=0,xya=0,na=0, xb=0,yb=0,x2b=0,y2b=0,xyb=0,nb=0;

  memset(a,0,sizeof(*a));
  a->x0=x0;
  a->x1=x1;
  if(x1>=n)x1=n-1;

  for(i=x0;i<=x1;i++){
    int quantized=vorbis_dBquant(flr+i);
    if(quantized){
      if(mdct[i]+info->twofitatten>=flr[i]){
        xa  += i;
        ya  += quantized;
        x2a += i*i;
        y2a += quantized*quantized;
        xya += i*quantized;
        na++;
      }else{
        xb  += i;
        yb  += quantized;
        x2b += i*i;
        y2b += quantized*quantized;
        xyb += i*quantized;
        nb++;
      }
    }
  }

  a->xa=xa;
  a->ya=ya;
  a->x2a=x2a;
  a->y2a=y2a;
  a->xya=xya;
  a->an=na;

  a->xb=xb;
  a->yb=yb;
  a->x2b=x2b;
  a->y2b=y2b;
  a->xyb=xyb;
  a->bn=nb;

  return(na);
}